

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  string *arg;
  pointer pbVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> git_fetch;
  char *git;
  string sha1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  OutputLogger reset_err;
  char *git_reset [5];
  OutputLogger fetch_out;
  OutputLogger fetch_err;
  OutputLogger reset_out;
  
  git = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&git_fetch,&git);
  reset_out.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)anon_var_dwarf_1bd1d60;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&git_fetch,(char **)&reset_out);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reset_out,"UpdateOptions",(allocator<char> *)&fetch_out);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&reset_out);
  std::__cxx11::string::~string((string *)&reset_out);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fetch_out,"GITUpdateOptions",(allocator<char> *)&fetch_err);
    cmCTest::GetCTestConfiguration((string *)&reset_out,pcVar1,(string *)&fetch_out);
    std::__cxx11::string::operator=((string *)&opts,(string *)&reset_out);
    std::__cxx11::string::~string((string *)&reset_out);
    std::__cxx11::string::~string((string *)&fetch_out);
  }
  cmSystemTools::ParseArguments(&args,&opts);
  for (pbVar5 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    reset_out.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar5->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&git_fetch,(char **)&reset_out);
  }
  reset_out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&git_fetch,(char **)&reset_out);
  cmProcessTools::OutputLogger::OutputLogger
            (&fetch_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&fetch_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,
                     git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&fetch_out,
                     (OutputParser *)&fetch_err,Auto);
  if (bVar2) {
    sha1._M_dataplus._M_p = (pointer)&sha1.field_2;
    sha1._M_string_length = 0;
    sha1.field_2._M_local_buf[0] = '\0';
    FindGitDir_abi_cxx11_((string *)&reset_out,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reset_err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reset_out,
                   "/FETCH_HEAD");
    std::__cxx11::string::~string((string *)&reset_out);
    std::ifstream::ifstream
              (&reset_out,(char *)reset_err.super_LineParser.super_OutputParser._vptr_OutputParser,
               _S_in|_S_bin);
    if ((*(byte *)((long)&reset_out.super_LineParser.Line._M_string_length +
                  (long)reset_out.super_LineParser.super_OutputParser._vptr_OutputParser[-3]) & 5)
        == 0) {
      git_reset[0] = (char *)(git_reset + 2);
      git_reset[1] = (char *)0x0;
      git_reset[2] = (char *)((ulong)git_reset[2] & 0xffffffffffffff00);
      while (sha1._M_string_length == 0) {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&reset_out,(string *)git_reset,(bool *)0x0,0xffffffffffffffff)
        ;
        if (!bVar2) {
          if (sha1._M_string_length == 0) {
            std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                            "FETCH_HEAD has no upstream branch candidate!\n");
            std::__cxx11::string::~string((string *)git_reset);
            goto LAB_004a10e8;
          }
          break;
        }
        poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"FETCH_HEAD> ");
        poVar3 = std::operator<<(poVar3,(string *)git_reset);
        std::operator<<(poVar3,"\n");
        lVar4 = std::__cxx11::string::find((char *)git_reset,0x69a0b1);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find((char)(string *)git_reset,9);
          if (lVar4 != -1) {
            std::__cxx11::string::operator=((string *)&sha1,(string *)git_reset);
            std::__cxx11::string::resize((ulong)&sha1);
          }
        }
      }
      std::__cxx11::string::~string((string *)git_reset);
      std::ifstream::~ifstream(&reset_out);
      std::__cxx11::string::~string((string *)&reset_err);
      git_reset[0] = git;
      git_reset[1] = "reset";
      git_reset[2] = "--hard";
      git_reset[3] = sha1._M_dataplus._M_p;
      git_reset[4] = (char *)0x0;
      cmProcessTools::OutputLogger::OutputLogger
                (&reset_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&reset_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-err> ");
      bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,git_reset,(OutputParser *)&reset_out,
                                  (OutputParser *)&reset_err,(char *)0x0,Auto);
      cmProcessTools::LineParser::~LineParser(&reset_err.super_LineParser);
      cmProcessTools::LineParser::~LineParser(&reset_out.super_LineParser);
    }
    else {
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Unable to open ");
      poVar3 = std::operator<<(poVar3,(string *)&reset_err);
      std::operator<<(poVar3,"\n");
LAB_004a10e8:
      std::ifstream::~ifstream(&reset_out);
      std::__cxx11::string::~string((string *)&reset_err);
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&sha1);
  }
  else {
    bVar2 = false;
  }
  cmProcessTools::LineParser::~LineParser(&fetch_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&fetch_out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar2;
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  const char* git = this->CommandLineTool.c_str();

  // Use "git fetch" to get remote commits.
  std::vector<char const*> git_fetch;
  git_fetch.push_back(git);
  git_fetch.push_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    git_fetch.push_back(arg.c_str());
  }

  // Sentinel argument.
  git_fetch.push_back(nullptr);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch.data(), &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  char const* git_reset[] = { git, "reset", "--hard", sha1.c_str(), nullptr };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(&git_reset[0], &reset_out, &reset_err);
}